

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O1

void __thiscall slang::OS::writeFile(OS *this,path *path,string_view contents)

{
  long lVar1;
  int iVar2;
  ofstream file;
  undefined1 local_228 [28];
  undefined4 auStack_20c [55];
  ios_base local_130 [264];
  
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            ((path *)local_228,(char (*) [2])0x26c299,auto_format);
  iVar2 = std::filesystem::__cxx11::path::compare((path *)this);
  std::filesystem::__cxx11::path::~path((path *)local_228);
  if (iVar2 == 0) {
    std::ostream::write((char *)&std::cout,contents._M_len);
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream(local_228,*(char **)this,_S_out);
    lVar1 = *(long *)(local_228._0_8_ + -0x18);
    *(undefined4 *)((long)auStack_20c + lVar1) = 5;
    std::ios::clear((int)local_228 + (int)lVar1);
    std::ostream::write(local_228,contents._M_len);
    std::ostream::flush();
    local_228._0_8_ = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_228 + 8));
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void OS::writeFile(const fs::path& path, std::string_view contents) {
    if (path == "-") {
        std::cout.write(contents.data(), (std::streamsize)contents.size());
        std::cout.flush();
    }
    else {
        std::ofstream file(path);
        file.exceptions(std::ios::failbit | std::ios::badbit);
        file.write(contents.data(), (std::streamsize)contents.size());
        file.flush();
    }
}